

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<3UL> * physical_model::gyroscope(void)

{
  vector<3UL> *in_RDI;
  initializer_list<float> list;
  undefined1 local_50 [8];
  float local_48 [1];
  matrix<3UL,_1UL> local_38;
  
  local_50._0_4_ =
       std::normal_distribution<float>::operator()
                 ((normal_distribution<float> *)gyr_noise_x,
                  (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                   *)gen);
  local_50._4_4_ =
       std::normal_distribution<float>::operator()
                 ((normal_distribution<float> *)gyr_noise_y,
                  (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                   *)gen);
  local_48[0] = std::normal_distribution<float>::operator()
                          ((normal_distribution<float> *)gyr_noise_z,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)gen);
  list._M_len = 3;
  list._M_array = (iterator)local_50;
  blas::vector<3UL>::vector((vector<3UL> *)&local_38,list);
  blas::matrix<3UL,_1UL>::operator+=(&gyroscope::random_walk.super_matrix<3UL,_1UL>,&local_38);
  blas::matrix<3UL,_1UL>::operator+((matrix<3UL,_1UL> *)gyr_real,(matrix<3UL,_1UL> *)gyr_bias);
  blas::matrix<3UL,_1UL>::operator+
            ((matrix<3UL,_1UL> *)local_50,&gyroscope::random_walk.super_matrix<3UL,_1UL>);
  (in_RDI->super_matrix<3UL,_1UL>)._vptr_matrix = (_func_int **)&PTR_to_string_abi_cxx11__00107ce8;
  *(undefined8 *)(in_RDI->super_matrix<3UL,_1UL>).data = local_38.data._0_8_;
  (in_RDI->super_matrix<3UL,_1UL>).data[2][0] = local_38.data[2][0];
  return in_RDI;
}

Assistant:

const blas::vector<3> gyroscope() {
        static blas::vector<3> random_walk;
        random_walk += {gyr_noise_x(gen), gyr_noise_y(gen), gyr_noise_z(gen)};
        return gyr_real + gyr_bias + random_walk;
    }